

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap-inl.h
# Opt level: O0

void heap_remove(heap *heap,heap_node *node,heap_compare_fn less_than)

{
  heap_node *parent;
  int iVar1;
  bool bVar2;
  uint local_44;
  int local_40;
  uint n;
  uint k;
  uint path;
  heap_node *child;
  heap_node **max;
  heap_node *smallest;
  heap_compare_fn less_than_local;
  heap_node *node_local;
  heap *heap_local;
  
  if (heap->nelts != 0) {
    n = 0;
    local_40 = 0;
    for (local_44 = heap->nelts; child = (heap_node *)heap, 1 < local_44; local_44 = local_44 >> 1)
    {
      n = n << 1 | local_44 & 1;
      local_40 = local_40 + 1;
    }
    for (; local_40 != 0; local_40 = local_40 + -1) {
      if ((n & 1) == 0) {
        child = child->left;
      }
      else {
        child = (heap_node *)&child->left->right;
      }
      n = n >> 1;
    }
    heap->nelts = heap->nelts - 1;
    parent = child->left;
    child->left = (heap_node *)0x0;
    if (parent == node) {
      if (parent == heap->min) {
        heap->min = (heap_node *)0x0;
      }
    }
    else {
      parent->left = node->left;
      parent->right = node->right;
      parent->parent = node->parent;
      if (parent->left != (heap_node *)0x0) {
        parent->left->parent = parent;
      }
      if (parent->right != (heap_node *)0x0) {
        parent->right->parent = parent;
      }
      if (node->parent == (heap_node *)0x0) {
        heap->min = parent;
      }
      else if (node->parent->left == node) {
        node->parent->left = parent;
      }
      else {
        node->parent->right = parent;
      }
      while( true ) {
        max = &parent->left;
        if ((parent->left != (heap_node *)0x0) &&
           (iVar1 = (*less_than)(parent->left,parent), iVar1 != 0)) {
          max = &parent->left->left;
        }
        if ((parent->right != (heap_node *)0x0) &&
           (iVar1 = (*less_than)(parent->right,(heap_node *)max), iVar1 != 0)) {
          max = &parent->right->left;
        }
        if ((heap_node *)max == parent) break;
        heap_node_swap(heap,parent,(heap_node *)max);
      }
      while( true ) {
        bVar2 = false;
        if (parent->parent != (heap_node *)0x0) {
          iVar1 = (*less_than)(parent,parent->parent);
          bVar2 = iVar1 != 0;
        }
        if (!bVar2) break;
        heap_node_swap(heap,parent->parent,parent);
      }
    }
  }
  return;
}

Assistant:

HEAP_EXPORT(void heap_remove(struct heap* heap,
                             struct heap_node* node,
                             heap_compare_fn less_than)) {
  struct heap_node* smallest;
  struct heap_node** max;
  struct heap_node* child;
  unsigned int path;
  unsigned int k;
  unsigned int n;

  if (heap->nelts == 0)
    return;

  /* Calculate the path from the min (the root) to the max, the left-most node
   * of the bottom row.
   */
  path = 0;
  for (k = 0, n = heap->nelts; n >= 2; k += 1, n /= 2)
    path = (path << 1) | (n & 1);

  /* Now traverse the heap using the path we calculated in the previous step. */
  max = &heap->min;
  while (k > 0) {
    if (path & 1)
      max = &(*max)->right;
    else
      max = &(*max)->left;
    path >>= 1;
    k -= 1;
  }

  heap->nelts -= 1;

  /* Unlink the max node. */
  child = *max;
  *max = NULL;

  if (child == node) {
    /* We're removing either the max or the last node in the tree. */
    if (child == heap->min) {
      heap->min = NULL;
    }
    return;
  }

  /* Replace the to be deleted node with the max node. */
  child->left = node->left;
  child->right = node->right;
  child->parent = node->parent;

  if (child->left != NULL) {
    child->left->parent = child;
  }

  if (child->right != NULL) {
    child->right->parent = child;
  }

  if (node->parent == NULL) {
    heap->min = child;
  } else if (node->parent->left == node) {
    node->parent->left = child;
  } else {
    node->parent->right = child;
  }

  /* Walk down the subtree and check at each node if the heap property holds.
   * It's a min heap so parent < child must be true.  If the parent is bigger,
   * swap it with the smallest child.
   */
  for (;;) {
    smallest = child;
    if (child->left != NULL && less_than(child->left, smallest))
      smallest = child->left;
    if (child->right != NULL && less_than(child->right, smallest))
      smallest = child->right;
    if (smallest == child)
      break;
    heap_node_swap(heap, child, smallest);
  }

  /* Walk up the subtree and check that each parent is less than the node
   * this is required, because `max` node is not guaranteed to be the
   * actual maximum in tree
   */
  while (child->parent != NULL && less_than(child, child->parent))
    heap_node_swap(heap, child->parent, child);
}